

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O1

int __thiscall cali::StringConverter::to_int(StringConverter *this,bool *okptr)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  char *local_30;
  
  __nptr = (this->m_str)._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    bVar5 = true;
    goto LAB_00190ba2;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  __cxa_begin_catch(uVar4);
  __cxa_end_catch();
  lVar3 = 0;
  bVar5 = false;
LAB_00190ba2:
  if (okptr != (bool *)0x0) {
    *okptr = bVar5;
  }
  return (int)lVar3;
}

Assistant:

int cali::StringConverter::to_int(bool* okptr) const
{
    bool ok  = false;
    int  res = 0;

    try {
        res = std::stoi(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}